

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jedi.cpp
# Opt level: O2

void drawMap(void)

{
  int c;
  int y_00;
  int y;
  int iVar1;
  int x;
  int iVar2;
  char *pcVar3;
  
  for (iVar2 = 0; iVar2 != 0x20; iVar2 = iVar2 + 1) {
    y_00 = 0;
    for (iVar1 = 0; iVar1 != 10; iVar1 = iVar1 + 1) {
      c = 0;
      if (((uint)(map_view_x + iVar2) < 0x50) && (c = 0, (uint)(map_view_y + iVar1) < 0x20)) {
        c = map_buffer[(uint)((map_view_y + iVar1) * 0x50 + map_view_x + iVar2)];
      }
      drawChar(iVar2 * 4,y_00,c);
      y_00 = y_00 + 6;
    }
  }
  iVar2 = 0;
  fillBox(0,0x3a,0x80,6,0xff);
  for (pcVar3 = status_line; *pcVar3 != '\0'; pcVar3 = pcVar3 + 1) {
    drawChar(iVar2,0x3a,(int)*pcVar3 | 0x100);
    iVar2 = iVar2 + 4;
  }
  return;
}

Assistant:

static void drawMap()
{
    for(int x=0; x<DISPLAY_WIDTH / 4; x++)
    {
        for(int y=0; y<DISPLAY_HEIGHT / 6; y++)
        {
            int n = 0;
            if ((x + map_view_x) >= 0 && (x + map_view_x) < NUMCOLS && (y + map_view_y) >= 0 && (y + map_view_y) < NUMLINES)
                n = map_buffer[(x + map_view_x) + (y + map_view_y) * NUMCOLS];

            drawChar(x*4, y*6, n);
        }
    }
    fillBox(0, DISPLAY_HEIGHT-6, DISPLAY_WIDTH, 6, 255);
    for(char* c=status_line; *c; c++)
    {
        drawChar((c-status_line)*4, DISPLAY_HEIGHT-6, (*c) | DISPLAY_INVERT);
    }
}